

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_sbar.cpp
# Opt level: O0

void __thiscall DBaseStatusBar::DetachAllMessages(DBaseStatusBar *this)

{
  DHUDMessage *pDVar1;
  DHUDMessage *next;
  DHUDMessage *probe;
  size_t i;
  DBaseStatusBar *this_local;
  
  for (probe = (DHUDMessage *)0x0; probe < (DHUDMessage *)0x3;
      probe = (DHUDMessage *)((long)&(probe->super_DObject)._vptr_DObject + 1)) {
    next = ::TObjPtr::operator_cast_to_DHUDMessage_((TObjPtr *)(this->Messages + (long)probe));
    TObjPtr<DHUDMessage>::operator=(this->Messages + (long)probe,(DHUDMessage *)0x0);
    while (next != (DHUDMessage *)0x0) {
      pDVar1 = ::TObjPtr::operator_cast_to_DHUDMessage_((TObjPtr *)&next->Next);
      (*(next->super_DObject)._vptr_DObject[4])();
      next = pDVar1;
    }
  }
  return;
}

Assistant:

void DBaseStatusBar::DetachAllMessages ()
{
	for (size_t i = 0; i < countof(Messages); ++i)
	{
		DHUDMessage *probe = Messages[i];

		Messages[i] = NULL;
		while (probe != NULL)
		{
			DHUDMessage *next = probe->Next;
			probe->Destroy();
			probe = next;
		}
	}
}